

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testdict.c
# Opt level: O1

int pool_bulk_lookup(StringPool *pool,xmlHashTablePtr hash,size_t num,int existing)

{
  char *pcVar1;
  size_t sVar2;
  xmlChar *pxVar3;
  ulong uVar4;
  long lVar5;
  ulong uVar6;
  xmlChar **ppxVar7;
  ulong uVar8;
  ulong uVar9;
  xmlChar *pxVar10;
  xmlChar *prefix [3];
  xmlChar *local [3];
  size_t local_88 [4];
  ulong local_68;
  ulong local_60;
  ulong local_58;
  ulong local_50;
  undefined8 local_48 [3];
  
  local_60 = pool->index;
  uVar6 = 0;
  if (num != 0 && local_60 < pool->num_strings) {
    uVar6 = 0;
    local_68 = 0;
    local_88[3] = num;
    do {
      ppxVar7 = pool->strings + local_60;
      uVar8 = 0;
      do {
        if ((int)uVar8 == 0) {
          sVar2 = pool->num_keys;
          uVar9 = uVar8;
          if (sVar2 == 3) {
            pxVar10 = (xmlChar *)xmlHashLookup3(hash,*ppxVar7,ppxVar7[1],ppxVar7[2]);
          }
          else if (sVar2 == 2) {
            pxVar10 = (xmlChar *)xmlHashLookup2(hash,*ppxVar7,ppxVar7[1]);
          }
          else if (sVar2 == 1) {
            pxVar10 = (xmlChar *)xmlHashLookup(hash,*ppxVar7);
          }
          else {
            pxVar10 = (xmlChar *)0x0;
          }
        }
        else {
          uVar9 = pool->num_keys;
          uVar4 = 0;
          local_58 = uVar8;
          local_50 = uVar6;
          do {
            if (uVar4 < uVar9) {
              pxVar10 = ppxVar7[uVar4];
              pcVar1 = strchr((char *)pxVar10,0x3a);
              if (pcVar1 == (char *)0x0) {
                local_88[uVar4] = 0;
              }
              else {
                sVar2 = xmlStrndup(pxVar10,(int)pcVar1 - (int)pxVar10);
                local_88[uVar4] = sVar2;
                pxVar10 = (xmlChar *)(pcVar1 + 1);
              }
            }
            else {
              local_88[uVar4] = 0;
              pxVar10 = (xmlChar *)0x0;
            }
            local_48[uVar4] = pxVar10;
            uVar4 = uVar4 + 1;
          } while (uVar4 != 3);
          pxVar10 = (xmlChar *)
                    xmlHashQLookup3(hash,local_88[0],local_48[0],local_88[1],local_48[1],local_88[2]
                                    ,local_48[2]);
          lVar5 = 0;
          do {
            (*_xmlFree)(local_88[lVar5]);
            lVar5 = lVar5 + 1;
            uVar6 = local_50;
            uVar9 = local_58;
          } while (lVar5 != 3);
        }
        if (existing == 0) {
          pxVar3 = (xmlChar *)0x0;
        }
        else {
          pxVar3 = *ppxVar7;
        }
        uVar6 = uVar6 & 0xffffffff;
        if (pxVar10 != pxVar3) {
          uVar6 = 0xffffffff;
        }
        uVar8 = (ulong)((int)uVar9 + 1);
      } while ((int)uVar9 == 0);
      local_60 = local_60 + pool->num_keys;
    } while ((local_60 < pool->num_strings) && (local_68 = local_68 + 1, local_68 < local_88[3]));
  }
  pool->index = local_60;
  return (int)uVar6;
}

Assistant:

static int
pool_bulk_lookup(StringPool *pool, xmlHashTablePtr hash, size_t num,
                 int existing) {
    size_t i, j;
    int ret = 0;

    for (i = pool->index, j = 0; i < pool->num_strings && j < num; j++) {
        xmlChar **str = &pool->strings[i];
        int q;

        for (q = 0; q < 2; q++) {
            xmlChar *res = NULL;

            if (q) {
                res = hash_qlookup(hash, str, pool->num_keys);
            } else {
                switch (pool->num_keys) {
                    case 1:
                        res = xmlHashLookup(hash, str[0]);
                        break;
                    case 2:
                        res = xmlHashLookup2(hash, str[0], str[1]);
                        break;
                    case 3:
                        res = xmlHashLookup3(hash, str[0], str[1], str[2]);
                        break;
                }
            }

            if (existing) {
                if (res != str[0])
                    ret = -1;
            } else {
                if (res != NULL)
                    ret = -1;
            }
        }

        i += pool->num_keys;
    }

    pool->index = i;
    return ret;
}